

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_dmc.c
# Opt level: O0

bool NES_DMC_np_Write(void *chip,UINT16 adr,UINT8 val)

{
  undefined1 uVar1;
  undefined4 uVar2;
  NES_DMC *dmc;
  UINT8 val_local;
  UINT16 adr_local;
  void *chip_local;
  
  if (adr == 0x4015) {
    *(bool *)((long)chip + 0x400ec) = (val & 4) != 0;
    *(bool *)((long)chip + 0x400ed) = (val & 8) != 0;
    if (*(char *)((long)chip + 0x400ec) == '\0') {
      *(undefined4 *)((long)chip + 0x400f0) = 0;
    }
    if (*(char *)((long)chip + 0x400ed) == '\0') {
      *(undefined4 *)((long)chip + 0x400f4) = 0;
    }
    if (((val & 0x10) == 0) || (*(char *)((long)chip + 0x400a5) != '\0')) {
      if ((val & 0x10) == 0) {
        *(undefined1 *)((long)chip + 0x400a5) = 0;
        *(undefined1 *)((long)chip + 0x400ee) = 0;
      }
    }
    else {
      *(undefined1 *)((long)chip + 0x400a5) = 1;
      *(undefined1 *)((long)chip + 0x400ee) = 1;
      *(uint *)((long)chip + 0x40074) = *(int *)((long)chip + 0x40058) << 6 | 0xc000;
      *(int *)((long)chip + 0x40078) = *(int *)((long)chip + 0x40054) * 0x10 + 1;
      *(undefined1 *)((long)chip + 0x400a4) = 0;
    }
    *(UINT8 *)((long)chip + 0x40051) = val;
    chip_local._7_1_ = true;
  }
  else {
    if (adr == 0x4017) {
      *(bool *)((long)chip + 0x40111) = (val & 0x40) == 0x40;
      if (*(char *)((long)chip + 0x40111) == '\0') {
        uVar1 = 0;
      }
      else {
        uVar1 = *(undefined1 *)((long)chip + 0x40110);
      }
      *(undefined1 *)((long)chip + 0x40110) = uVar1;
      *(undefined4 *)((long)chip + 0x40100) = 0;
      if ((val & 0x80) == 0) {
        *(undefined4 *)((long)chip + 0x4010c) = 4;
        *(undefined4 *)((long)chip + 0x40108) = 1;
      }
      else {
        *(undefined4 *)((long)chip + 0x4010c) = 5;
        *(undefined4 *)((long)chip + 0x40108) = 0;
        FrameSequence((NES_DMC *)chip,*(int *)((long)chip + 0x40108));
        *(int *)((long)chip + 0x40108) = *(int *)((long)chip + 0x40108) + 1;
      }
    }
    if ((adr < 0x4008) || (0x4013 < adr)) {
      chip_local._7_1_ = false;
    }
    else {
      *(UINT8 *)((ulong)adr + 0x3c03c + (long)chip) = val;
      switch(adr) {
      case 0x4008:
        *(char *)((long)chip + 0x400cd) = (char)((int)(uint)val >> 7);
        *(uint *)((long)chip + 0x400c8) = val & 0x7f;
        break;
      case 0x4009:
        break;
      case 0x400a:
        *(uint *)((long)chip + 0x400c0) = (uint)val | *(uint *)((long)chip + 0x400c0) & 0x700;
        if (*(uint *)((long)chip + 0x400c0) < *(uint *)((long)chip + 0x400a8)) {
          *(undefined4 *)((long)chip + 0x400a8) = *(undefined4 *)((long)chip + 0x400c0);
        }
        break;
      case 0x400b:
        *(uint *)((long)chip + 0x400c0) = *(uint *)((long)chip + 0x400c0) & 0xff | (val & 7) << 8;
        if (*(uint *)((long)chip + 0x400c0) < *(uint *)((long)chip + 0x400a8)) {
          *(undefined4 *)((long)chip + 0x400a8) = *(undefined4 *)((long)chip + 0x400c0);
        }
        *(undefined1 *)((long)chip + 0x400cc) = 1;
        if (*(char *)((long)chip + 0x400ec) != '\0') {
          *(uint *)((long)chip + 0x400f0) =
               (uint)NES_DMC_np_Write::length_table[(int)(uint)val >> 3];
        }
        break;
      case 0x400c:
        *(uint *)((long)chip + 0x400d0) = val & 0xf;
        *(uint *)((long)chip + 0x400e0) = val & 0xf;
        *(byte *)((long)chip + 0x400dd) = (byte)((int)(uint)val >> 4) & 1;
        *(byte *)((long)chip + 0x400dc) = (byte)((int)(uint)val >> 5) & 1;
        break;
      case 0x400d:
        break;
      case 0x400e:
        if (*(int *)((long)chip + 0x40014) == 0) {
          *(undefined4 *)((long)chip + 0x400d8) = 2;
        }
        else {
          uVar2 = 2;
          if ((val & 0x80) != 0) {
            uVar2 = 0x40;
          }
          *(undefined4 *)((long)chip + 0x400d8) = uVar2;
        }
        *(UINT32 *)((long)chip + 0x400b8) =
             wavlen_table[*(int *)((long)chip + 0x4009c)][(int)(val & 0xf)];
        if (*(uint *)((long)chip + 0x400b8) < *(uint *)((long)chip + 0x400ac)) {
          *(undefined4 *)((long)chip + 0x400ac) = *(undefined4 *)((long)chip + 0x400b8);
        }
        break;
      case 0x400f:
        if (*(char *)((long)chip + 0x400ed) != '\0') {
          *(uint *)((long)chip + 0x400f4) =
               (uint)NES_DMC_np_Write::length_table[(int)(uint)val >> 3];
        }
        *(undefined1 *)((long)chip + 0x400de) = 1;
        break;
      case 0x4010:
        *(int *)((long)chip + 0x400a0) = (int)(uint)val >> 6;
        *(UINT32 *)((long)chip + 0x400bc) =
             freq_table[*(int *)((long)chip + 0x4009c)][(int)(val & 0xf)];
        if (*(uint *)((long)chip + 0x400bc) < *(uint *)((long)chip + 0x400b0)) {
          *(undefined4 *)((long)chip + 0x400b0) = *(undefined4 *)((long)chip + 0x400bc);
        }
        break;
      case 0x4011:
        if (*(int *)((long)chip + 0x40010) != 0) {
          *(ushort *)((long)chip + 0x40080) = (ushort)((int)(uint)val >> 1) & 0x3f;
          *(uint *)((long)chip + 0x40084) = val & 1;
          *(undefined1 *)((long)chip + 0x40088) = 1;
        }
        break;
      case 0x4012:
        *(uint *)((long)chip + 0x40058) = (uint)val;
        break;
      case 0x4013:
        *(uint *)((long)chip + 0x40054) = (uint)val;
        break;
      default:
        return false;
      }
      chip_local._7_1_ = true;
    }
  }
  return chip_local._7_1_;
}

Assistant:

bool NES_DMC_np_Write(void* chip, UINT16 adr, UINT8 val)
{
	static const UINT8 length_table[32] = {
		0x0A, 0xFE,
		0x14, 0x02,
		0x28, 0x04,
		0x50, 0x06,
		0xA0, 0x08,
		0x3C, 0x0A,
		0x0E, 0x0C,
		0x1A, 0x0E,
		0x0C, 0x10,
		0x18, 0x12,
		0x30, 0x14,
		0x60, 0x16,
		0xC0, 0x18,
		0x48, 0x1A,
		0x10, 0x1C,
		0x20, 0x1E
	};
	NES_DMC* dmc = (NES_DMC*)chip;

	if (adr == 0x4015)
	{
		dmc->enable[0] = (val & 4) ? true : false;
		dmc->enable[1] = (val & 8) ? true : false;

		if (!dmc->enable[0])
		{
			dmc->length_counter[0] = 0;
		}
		if (!dmc->enable[1])
		{
			dmc->length_counter[1] = 0;
		}

		if ((val & 16)&&!dmc->active)
		{
			dmc->enable[2] = dmc->active = true;
			dmc->daddress = (0xC000 | (dmc->adr_reg << 6));
			dmc->length = (dmc->len_reg << 4) + 1;
			dmc->irq = 0;
		}
		else if (!(val & 16))
		{
			dmc->enable[2] = dmc->active = false;
		}

		dmc->reg[adr-0x4008] = val;
		return true;
	}

	if (adr == 0x4017)
	{
		//DEBUG_OUT("4017 = %02X\n", val);
		dmc->frame_irq_enable = ((val & 0x40) == 0x40);
		dmc->frame_irq = (dmc->frame_irq_enable ? dmc->frame_irq : 0);
		dmc->frame_sequence_count = 0;
		if (val & 0x80)
		{
			dmc->frame_sequence_steps = 5;
			dmc->frame_sequence_step = 0;
			FrameSequence(dmc, dmc->frame_sequence_step);
			++dmc->frame_sequence_step;
		}
		else
		{
			dmc->frame_sequence_steps = 4;
			dmc->frame_sequence_step = 1;
		}
	}

	if (adr<0x4008||0x4013<adr)
		return false;

	dmc->reg[adr-0x4008] = val&0xff;

	//DEBUG_OUT("$%04X %02X\n", adr, val);

	switch (adr)
	{

	// tri

	case 0x4008:
		dmc->linear_counter_control = (val >> 7) & 1;
		dmc->linear_counter_reload = val & 0x7F;
		break;

	case 0x4009:
		break;

	case 0x400a:
		dmc->tri_freq = val | (dmc->tri_freq & 0x700) ;
		if (dmc->counter[0] > dmc->tri_freq) dmc->counter[0] = dmc->tri_freq;
		break;

	case 0x400b:
		dmc->tri_freq = (dmc->tri_freq & 0xff) | ((val & 0x7) << 8) ;
		if (dmc->counter[0] > dmc->tri_freq) dmc->counter[0] = dmc->tri_freq;
		dmc->linear_counter_halt = true;
		if (dmc->enable[0])
		{
			dmc->length_counter[0] = length_table[(val >> 3) & 0x1f];
		}
		break;

	// noise

	case 0x400c:
		dmc->noise_volume = val & 15;
		dmc->envelope_div_period = val & 15;
		dmc->envelope_disable = (val >> 4) & 1;
		dmc->envelope_loop = (val >> 5) & 1;
		break;

	case 0x400d:
		break;

	case 0x400e:
		if (dmc->option[OPT_ENABLE_PNOISE])
			dmc->noise_tap = (val & 0x80) ? (1<<6) : (1<<1);
		else
			dmc->noise_tap = (1<<1);
		dmc->nfreq = wavlen_table[dmc->pal][val&15];
		if (dmc->counter[1] > dmc->nfreq) dmc->counter[1] = dmc->nfreq;
		break;

	case 0x400f:
		if (dmc->enable[1])
		{
			dmc->length_counter[1] = length_table[(val >> 3) & 0x1f];
		}
		dmc->envelope_write = true;
		break;

	// dmc

	case 0x4010:
		dmc->mode = (val >> 6) & 3;
		dmc->dfreq = freq_table[dmc->pal][val&15];
		if (dmc->counter[2] > dmc->dfreq) dmc->counter[2] = dmc->dfreq;
		break;

	case 0x4011:
		if (dmc->option[OPT_ENABLE_4011])
		{
			dmc->damp = (val >> 1) & 0x3f;
			dmc->dac_lsb = val & 1;
			dmc->dmc_pop = true;
		}
		break;

	case 0x4012:
		dmc->adr_reg = val&0xff;
		// ここでdaddressは更新されない
		break;

	case 0x4013:
		dmc->len_reg = val&0xff;
		// ここでlengthは更新されない
		break;

	default:
		return false;
	}

	return true;
}